

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.cpp
# Opt level: O2

void __thiscall channel::~channel(channel *this)

{
  LogMessage *pLVar1;
  Log LStack_48;
  
  this->_vptr_channel = (_func_int **)&PTR__channel_0011ab20;
  close(this->fd);
  Log::Log(&LStack_48,0x2c,
           "/workspace/llm4binary/github/license_all_cmakelists_25/MR-Wuhaha[P]WebServer/channel.cpp"
          );
  pLVar1 = Log::PutMessage(&LStack_48);
  pLVar1 = LogMessage::operator<<(pLVar1,"client fd: ");
  pLVar1 = LogMessage::operator<<(pLVar1,this->fd);
  LogMessage::operator<<(pLVar1," has been closed");
  Log::~Log(&LStack_48);
  if (this->read_buff != (char *)0x0) {
    operator_delete__(this->read_buff);
  }
  if (this->write_buff != (char *)0x0) {
    operator_delete__(this->write_buff);
  }
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->wp_time_round_item).
              super___weak_ptr<TimeRoundItem<channel>,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_enable_shared_from_this<channel>)._M_weak_this.
              super___weak_ptr<channel,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

channel::~channel()
{
    close(fd);
    LOG <<"client fd: "<<fd<<" has been closed";
    delete[] read_buff;
    delete[] write_buff;
}